

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O1

Am_Wrapper * __thiscall Key_Offset_Store_Data::Make_Unique(Key_Offset_Store_Data *this)

{
  uint uVar1;
  Key_Offset_Store_Data *pKVar2;
  
  uVar1 = (this->super_Am_Wrapper).refs;
  pKVar2 = this;
  if (uVar1 != 1) {
    uVar1 = uVar1 - 1;
    (this->super_Am_Wrapper).refs = uVar1;
    if (uVar1 == 0) {
      (*(this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])(this);
    }
    pKVar2 = (Key_Offset_Store_Data *)operator_new(0x18);
    (pKVar2->super_Am_Wrapper).refs = 1;
    (pKVar2->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
         (_func_int **)&PTR_ID_002e3ac8;
    *(undefined2 *)&(pKVar2->super_Am_Wrapper).field_0xc =
         *(undefined2 *)&(this->super_Am_Wrapper).field_0xc;
    pKVar2->offset = this->offset;
    pKVar2->multiplier = this->multiplier;
  }
  return &pKVar2->super_Am_Wrapper;
}

Assistant:

inline void
modify_value(Am_Value &value, int offset, float multiplier)
{
  switch (value.type) {
  case Am_INT:
  case Am_LONG:
    value.value.long_value =
        (long)(value.value.long_value * multiplier) + offset;
    break;
  case Am_FLOAT:
    value.value.float_value = (value.value.float_value * multiplier) + offset;
    break;
  case Am_DOUBLE: {
    double d_value = value;
    d_value = (d_value * multiplier) + offset;
    value = d_value;
    break;
  }
  default:
    break;
  }
}